

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflatePending(z_streamp strm,uint *pending,int *bits)

{
  int iVar1;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    if (pending != (uint *)0x0) {
      *pending = (uint)strm->state->pending;
    }
    iVar1 = 0;
    if (bits != (int *)0x0) {
      *bits = strm->state->bi_valid;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int ZEXPORT deflatePending(z_streamp strm, unsigned *pending, int *bits) {
    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    if (pending != Z_NULL)
        *pending = strm->state->pending;
    if (bits != Z_NULL)
        *bits = strm->state->bi_valid;
    return Z_OK;
}